

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergeFrom
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  LogMessage *other;
  GeneratedCodeInfo *this_00;
  undefined8 *puVar4;
  undefined1 *from_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x4be);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (from->name_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      internal::ArenaStringPtr::Set(&this->name_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar4);
    }
    if ((uVar1 & 2) != 0) {
      pvVar2 = (from->insertion_point_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      internal::ArenaStringPtr::Set
                (&this->insertion_point_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar4);
    }
    if ((uVar1 & 4) != 0) {
      pvVar2 = (from->content_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 4;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      internal::ArenaStringPtr::Set(&this->content_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar4);
    }
    if ((uVar1 & 8) != 0) {
      this_00 = _internal_mutable_generated_code_info(this);
      from_00 = (undefined1 *)from->generated_code_info_;
      if ((GeneratedCodeInfo *)from_00 == (GeneratedCodeInfo *)0x0) {
        from_00 = _GeneratedCodeInfo_default_instance_;
      }
      GeneratedCodeInfo::MergeFrom(this_00,(GeneratedCodeInfo *)from_00);
    }
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(from->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeFrom(const CodeGeneratorResponse_File& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_insertion_point(from._internal_insertion_point());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_content(from._internal_content());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_generated_code_info()->::PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo::MergeFrom(from._internal_generated_code_info());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}